

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3img.cpp
# Opt level: O2

void __thiscall CTcGenTarg::write_funcdep_to_object_file(CTcGenTarg *this,CVmFile *fp)

{
  size_t buflen;
  tc_fnset_entry *ptVar1;
  
  CVmFile::write_uint2(fp,this->fnset_cnt_);
  ptVar1 = (tc_fnset_entry *)&this->fnset_head_;
  while (ptVar1 = ptVar1->nxt, ptVar1 != (tc_fnset_entry *)0x0) {
    buflen = strlen(ptVar1->nm);
    CVmFile::write_uint2(fp,(uint)buflen);
    CVmFile::write_bytes(fp,ptVar1->nm,buflen);
  }
  return;
}

Assistant:

void CTcGenTarg::write_funcdep_to_object_file(CVmFile *fp)
{
    tc_fnset_entry *cur;

    /* write the count */
    fp->write_uint2(fnset_cnt_);

    /* write the entries */
    for (cur = fnset_head_ ; cur != 0 ; cur = cur->nxt)
    {
        size_t len;

        len = strlen(cur->nm);
        fp->write_uint2(len);
        fp->write_bytes(cur->nm, len);
    }
}